

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O3

string * gtest_crashFilescrashProblems_EvalGenerateName__abi_cxx11_
                   (string *__return_storage_ptr__,TestParamInfo<int> *info)

{
  bool bVar1;
  testing atStack_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) goto LAB_0012f814;
  testing::Range<int,int>(atStack_28,1,0x1d,1);
  if (local_20 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0012f814;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_20->_M_use_count = local_20->_M_use_count + 1;
    UNLOCK();
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0012f807;
  }
  else {
    local_20->_M_use_count = local_20->_M_use_count + 1;
LAB_0012f807:
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
LAB_0012f814:
  testing::internal::DefaultParamName<int>(__return_storage_ptr__,info);
  return __return_storage_ptr__;
}

Assistant:

TEST(fuzzFailures, timeouts)
{  // testing string that have caused a timeout from fuzz testing
    EXPECT_NO_THROW(unit_from_string("3*3*"));
    EXPECT_NO_THROW(unit_from_string("((())"));
}